

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::FileDescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  MessageLite *pMVar3;
  MessageLite *to_msg_00;
  _func_int **pp_Var4;
  void *pvVar5;
  Nonnull<const_char_*> pcVar6;
  Arena *pAVar7;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar6 != (Nonnull<const_char_*>)0x0) goto LAB_00254e32;
  if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
    internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_);
  }
  if ((int)from_msg[3]._internal_metadata_.ptr_ != 0) {
    internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)(to_msg + 3),(RepeatedPtrFieldBase *)(from_msg + 3),
               Arena::CopyConstruct<google::protobuf::DescriptorProto>);
  }
  if (*(int *)&from_msg[5]._vptr_MessageLite != 0) {
    internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)&to_msg[4]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[4]._internal_metadata_,
               Arena::CopyConstruct<google::protobuf::EnumDescriptorProto>);
  }
  if ((int)from_msg[6]._internal_metadata_.ptr_ != 0) {
    internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)(to_msg + 6),(RepeatedPtrFieldBase *)(from_msg + 6),
               Arena::CopyConstruct<google::protobuf::ServiceDescriptorProto>);
  }
  if (*(int *)&from_msg[8]._vptr_MessageLite != 0) {
    internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)&to_msg[7]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[7]._internal_metadata_,
               Arena::CopyConstruct<google::protobuf::FieldDescriptorProto>);
  }
  RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 9),(RepeatedField<int> *)(from_msg + 9));
  RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 10),(RepeatedField<int> *)(from_msg + 10));
  if ((int)from_msg[0xb]._internal_metadata_.ptr_ != 0) {
    internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)(to_msg + 0xb),(RepeatedPtrFieldBase *)(from_msg + 0xb));
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 0x3f) == 0) goto LAB_00254da1;
  if ((uVar1 & 1) != 0) {
    uVar2 = from_msg[0xc]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
    pAVar7 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar7 & 1) != 0) {
      pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[0xc]._internal_metadata_,
               (string *)(uVar2 & 0xfffffffffffffffc),pAVar7);
  }
  if ((uVar1 & 2) != 0) {
    pp_Var4 = from_msg[0xd]._vptr_MessageLite;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
    pAVar7 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar7 & 1) != 0) {
      pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 0xd),(string *)((ulong)pp_Var4 & 0xfffffffffffffffc),
               pAVar7);
  }
  if ((uVar1 & 4) != 0) {
    uVar2 = from_msg[0xd]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 4;
    pAVar7 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar7 & 1) != 0) {
      pAVar7 = *(Arena **)((ulong)pAVar7 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[0xd]._internal_metadata_,
               (string *)(uVar2 & 0xfffffffffffffffc),pAVar7);
  }
  if ((uVar1 & 8) != 0) {
    pMVar3 = (MessageLite *)from_msg[0xe]._vptr_MessageLite;
    if (pMVar3 != (MessageLite *)0x0) {
      if ((MessageLite *)to_msg[0xe]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var4 = (_func_int **)Arena::CopyConstruct<google::protobuf::FileOptions>(arena,pMVar3);
        to_msg[0xe]._vptr_MessageLite = pp_Var4;
      }
      else {
        FileOptions::MergeImpl((MessageLite *)to_msg[0xe]._vptr_MessageLite,pMVar3);
      }
      goto LAB_00254d56;
    }
    MergeImpl((FileDescriptorProto *)&stack0xffffffffffffffd0);
LAB_00254e28:
    MergeImpl((FileDescriptorProto *)&stack0xffffffffffffffd0);
LAB_00254e32:
    MergeImpl();
  }
LAB_00254d56:
  if ((uVar1 & 0x10) != 0) {
    pMVar3 = (MessageLite *)from_msg[0xe]._internal_metadata_.ptr_;
    if (pMVar3 == (MessageLite *)0x0) goto LAB_00254e28;
    to_msg_00 = (MessageLite *)to_msg[0xe]._internal_metadata_.ptr_;
    if (to_msg_00 == (MessageLite *)0x0) {
      pvVar5 = Arena::CopyConstruct<google::protobuf::SourceCodeInfo>(arena,pMVar3);
      to_msg[0xe]._internal_metadata_.ptr_ = (intptr_t)pvVar5;
    }
    else {
      SourceCodeInfo::MergeImpl(to_msg_00,pMVar3);
    }
  }
  if ((uVar1 & 0x20) != 0) {
    *(undefined4 *)&to_msg[0xf]._vptr_MessageLite = *(undefined4 *)&from_msg[0xf]._vptr_MessageLite;
  }
LAB_00254da1:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void FileDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FileDescriptorProto*>(&to_msg);
  auto& from = static_cast<const FileDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_dependency()->MergeFrom(from._internal_dependency());
  _this->_internal_mutable_message_type()->MergeFrom(
      from._internal_message_type());
  _this->_internal_mutable_enum_type()->MergeFrom(
      from._internal_enum_type());
  _this->_internal_mutable_service()->MergeFrom(
      from._internal_service());
  _this->_internal_mutable_extension()->MergeFrom(
      from._internal_extension());
  _this->_internal_mutable_public_dependency()->MergeFrom(from._internal_public_dependency());
  _this->_internal_mutable_weak_dependency()->MergeFrom(from._internal_weak_dependency());
  _this->_internal_mutable_option_dependency()->MergeFrom(from._internal_option_dependency());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_package(from._internal_package());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_syntax(from._internal_syntax());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.source_code_info_ != nullptr);
      if (_this->_impl_.source_code_info_ == nullptr) {
        _this->_impl_.source_code_info_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.source_code_info_);
      } else {
        _this->_impl_.source_code_info_->MergeFrom(*from._impl_.source_code_info_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.edition_ = from._impl_.edition_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}